

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int SaveEXR(float *data,int width,int height,int components,int save_as_fp16,char *outfilename,
           char **err)

{
  int iVar1;
  ostream *poVar2;
  EXRChannelInfo *__dest;
  long lVar3;
  int *piVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  size_type __new_size;
  float *image_ptr [4];
  vector<float,_std::allocator<float>_> images [4];
  EXRImage image;
  stringstream ss;
  ostream local_1a8 [88];
  EXRChannelInfo *local_150;
  int *local_148;
  int local_140;
  int local_13c;
  int *local_138;
  
  if (((uint)components < 5) && ((0x1aU >> (components & 0x1fU) & 1) != 0)) {
    memset(&ss,0,0x188);
    local_13c = 3;
    if (width < 0x10) {
      local_13c = (uint)(0xf < height) * 3;
    }
    __new_size = (long)height * (long)width;
    image.width = 0;
    image.height = 0;
    image.level_x = 0;
    image.level_y = 0;
    image.images = (uchar **)0x0;
    image.tiles = (EXRTile *)0x0;
    image.next_level = (TEXRImage *)0x0;
    image.num_tiles = 0;
    image.num_channels = components;
    images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (components == 1) {
      std::vector<float,_std::allocator<float>_>::resize(images,__new_size);
      memcpy(images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,data,__new_size * 4);
      image_ptr[2] = (float *)0x0;
      image_ptr[3] = (float *)0x0;
      image_ptr[0] = (float *)0x0;
      image_ptr[1] = (float *)0x0;
      image_ptr[0] = std::vector<float,_std::allocator<float>_>::at(images,0);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize(images,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(images + 1,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(images + 2,__new_size);
      std::vector<float,_std::allocator<float>_>::resize(images + 3,__new_size);
      if (components == 4) {
        pfVar5 = data + 3;
        for (lVar3 = 0; __new_size - lVar3 != 0; lVar3 = lVar3 + 1) {
          images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = pfVar5[-3];
          images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = pfVar5[-2];
          images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = pfVar5[-1];
          images[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = *pfVar5;
          pfVar5 = pfVar5 + 4;
        }
      }
      else {
        pfVar5 = data + 2;
        for (lVar3 = 0; __new_size - lVar3 != 0; lVar3 = lVar3 + 1) {
          images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = pfVar5[-2];
          images[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = pfVar5[-1];
          images[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = *pfVar5;
          pfVar5 = pfVar5 + (uint)components;
        }
      }
      image_ptr[2] = (float *)0x0;
      image_ptr[3] = (float *)0x0;
      image_ptr[0] = (float *)0x0;
      image_ptr[1] = (float *)0x0;
      if (components == 4) {
        image_ptr[0] = std::vector<float,_std::allocator<float>_>::at(images + 3,0);
        image_ptr[1] = std::vector<float,_std::allocator<float>_>::at(images + 2,0);
        image_ptr[2] = std::vector<float,_std::allocator<float>_>::at(images + 1,0);
        image_ptr[3] = std::vector<float,_std::allocator<float>_>::at(images,0);
      }
      else if (components == 3) {
        image_ptr[0] = std::vector<float,_std::allocator<float>_>::at(images + 2,0);
        image_ptr[1] = std::vector<float,_std::allocator<float>_>::at(images + 1,0);
        image_ptr[2] = std::vector<float,_std::allocator<float>_>::at(images,0);
      }
    }
    image.images = (uchar **)image_ptr;
    image.height = height;
    image.width = width;
    local_140 = components;
    __dest = (EXRChannelInfo *)malloc((ulong)(uint)(components * 0x110));
    local_150 = __dest;
    if (components == 4) {
      strncpy((char *)__dest,"A",0xff);
      strncpy(__dest[1].name,"B",0xff);
      strncpy(__dest[2].name,"G",0xff);
      strncpy(__dest[3].name,"R",0xff);
      __dest->name[1] = '\0';
      __dest[1].name[1] = '\0';
      __dest[2].name[1] = '\0';
      lVar3 = 0x331;
    }
    else if (components == 3) {
      strncpy((char *)__dest,"B",0xff);
      strncpy(__dest[1].name,"G",0xff);
      strncpy(__dest[2].name,"R",0xff);
      __dest->name[1] = '\0';
      __dest[1].name[1] = '\0';
      lVar3 = 0x221;
    }
    else {
      strncpy((char *)__dest,"A",0xff);
      lVar3 = 1;
    }
    __dest->name[lVar3] = '\0';
    piVar4 = (int *)malloc((long)components << 2);
    local_148 = piVar4;
    local_138 = (int *)malloc((long)components << 2);
    uVar6 = 0;
    uVar7 = (ulong)(uint)components;
    if (components < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      piVar4[uVar6] = 2;
      local_138[uVar6] = (save_as_fp16 < 1) + 1;
    }
    iVar1 = SaveEXRImageToFile(&image,(EXRHeader *)&ss,outfilename,err);
    free(local_150);
    free(local_148);
    free(local_138);
    lVar3 = 0x48;
    do {
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)
                 ((long)&images[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar3));
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != -0x18);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_1a8,"Unsupported component value : ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,components);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    tinyexr::SetErrorMessage((string *)images,err);
    std::__cxx11::string::~string((string *)images);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    iVar1 = -3;
  }
  return iVar1;
}

Assistant:

int SaveEXR(const float *data, int width, int height, int components,
            const int save_as_fp16, const char *outfilename, const char **err) {
  if ((components == 1) || components == 3 || components == 4) {
    // OK
  } else {
    std::stringstream ss;
    ss << "Unsupported component value : " << components << std::endl;

    tinyexr::SetErrorMessage(ss.str(), err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRHeader header;
  InitEXRHeader(&header);

  if ((width < 16) && (height < 16)) {
    // No compression for small image.
    header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;
  } else {
    header.compression_type = TINYEXR_COMPRESSIONTYPE_ZIP;
  }

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = components;

  std::vector<float> images[4];
  const size_t pixel_count =
      static_cast<size_t>(width) * static_cast<size_t>(height);

  if (components == 1) {
    images[0].resize(pixel_count);
    memcpy(images[0].data(), data, sizeof(float) * pixel_count);
  } else {
    images[0].resize(pixel_count);
    images[1].resize(pixel_count);
    images[2].resize(pixel_count);
    images[3].resize(pixel_count);

    // Split RGB(A)RGB(A)RGB(A)... into R, G and B(and A) layers
    if (components == 4) {
       for (size_t i = 0; i < pixel_count; i++) {
         images[0][i] = data[static_cast<size_t>(components) * i + 0];
         images[1][i] = data[static_cast<size_t>(components) * i + 1];
         images[2][i] = data[static_cast<size_t>(components) * i + 2];
         images[3][i] = data[static_cast<size_t>(components) * i + 3];
       }
    } else {
       for (size_t i = 0; i < pixel_count; i++) {
         images[0][i] = data[static_cast<size_t>(components) * i + 0];
         images[1][i] = data[static_cast<size_t>(components) * i + 1];
         images[2][i] = data[static_cast<size_t>(components) * i + 2];
       }
    }
  }

  float *image_ptr[4] = {0, 0, 0, 0};
  if (components == 4) {
    image_ptr[0] = &(images[3].at(0));  // A
    image_ptr[1] = &(images[2].at(0));  // B
    image_ptr[2] = &(images[1].at(0));  // G
    image_ptr[3] = &(images[0].at(0));  // R
  } else if (components == 3) {
    image_ptr[0] = &(images[2].at(0));  // B
    image_ptr[1] = &(images[1].at(0));  // G
    image_ptr[2] = &(images[0].at(0));  // R
  } else if (components == 1) {
    image_ptr[0] = &(images[0].at(0));  // A
  }

  image.images = reinterpret_cast<unsigned char **>(image_ptr);
  image.width = width;
  image.height = height;

  header.num_channels = components;
  header.channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(header.num_channels)));
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  if (components == 4) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
    strncpy_s(header.channels[1].name, "B", 255);
    strncpy_s(header.channels[2].name, "G", 255);
    strncpy_s(header.channels[3].name, "R", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
    strncpy(header.channels[1].name, "B", 255);
    strncpy(header.channels[2].name, "G", 255);
    strncpy(header.channels[3].name, "R", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
    header.channels[1].name[strlen("B")] = '\0';
    header.channels[2].name[strlen("G")] = '\0';
    header.channels[3].name[strlen("R")] = '\0';
  } else if (components == 3) {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "B", 255);
    strncpy_s(header.channels[1].name, "G", 255);
    strncpy_s(header.channels[2].name, "R", 255);
#else
    strncpy(header.channels[0].name, "B", 255);
    strncpy(header.channels[1].name, "G", 255);
    strncpy(header.channels[2].name, "R", 255);
#endif
    header.channels[0].name[strlen("B")] = '\0';
    header.channels[1].name[strlen("G")] = '\0';
    header.channels[2].name[strlen("R")] = '\0';
  } else {
#ifdef _MSC_VER
    strncpy_s(header.channels[0].name, "A", 255);
#else
    strncpy(header.channels[0].name, "A", 255);
#endif
    header.channels[0].name[strlen("A")] = '\0';
  }

  header.pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  header.requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(header.num_channels)));
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] =
        TINYEXR_PIXELTYPE_FLOAT;  // pixel type of input image

    if (save_as_fp16 > 0) {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_HALF;  // save with half(fp16) pixel format
    } else {
      header.requested_pixel_types[i] =
          TINYEXR_PIXELTYPE_FLOAT;  // save with float(fp32) pixel format(i.e.
                                    // no precision reduction)
    }
  }

  int ret = SaveEXRImageToFile(&image, &header, outfilename, err);

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  return ret;
}